

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::STA_ID_X(CPU *this)

{
  byte bVar1;
  uint16_t address;
  
  this->cycles = 6;
  bVar1 = GetByte(this);
  address = ReadWord(this,(ushort)this->X + (ushort)bVar1);
  WriteByte(this,address,this->A);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::STA_ID_X()
{
    cycles = 6;
    WriteByte(ReadWord((uint16_t)(GetByte() + X)), A);
    cycles--;
}